

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialNonce::ConfidentialNonce(ConfidentialNonce *this,Pubkey *pubkey)

{
  ByteData local_28;
  
  Pubkey::GetData(&local_28,pubkey);
  ConfidentialNonce(this,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ConfidentialNonce::ConfidentialNonce(const Pubkey &pubkey)
    : ConfidentialNonce(pubkey.GetData()) {
  // do nothing
}